

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
          (AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *this,
          int log2_expansion_factor)

{
  byte bVar1;
  int iVar2;
  AlexNode<double,_double> *pAVar3;
  double dVar4;
  AlexNode<double,_double> **ppAVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  new_allocator<alex::AlexNode<double,_double>_*> local_29;
  
  if (-1 < log2_expansion_factor) {
    iVar9 = this->num_children_ << (log2_expansion_factor & 0x1fU);
    iVar8 = 0;
    ppAVar5 = __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                        (&local_29,(long)iVar9,(void *)0x0);
    iVar2 = this->num_children_;
    while (iVar8 < iVar2) {
      iVar7 = iVar8 << (log2_expansion_factor & 0x1fU);
      pAVar3 = this->children_[iVar8];
      bVar1 = pAVar3->duplication_factor_;
      iVar8 = iVar8 + (1 << (bVar1 & 0x1f));
      for (lVar6 = (long)iVar7; lVar6 < iVar8 << (log2_expansion_factor & 0x1fU); lVar6 = lVar6 + 1)
      {
        ppAVar5[lVar6] = pAVar3;
      }
      pAVar3->duplication_factor_ = bVar1 + (char)log2_expansion_factor;
    }
    iVar8 = 1 << (log2_expansion_factor & 0x1fU);
    operator_delete(this->children_,(long)iVar2 << 3);
    dVar10 = (double)iVar8;
    this->children_ = ppAVar5;
    this->num_children_ = iVar9;
    dVar4 = (this->super_AlexNode<double,_double>).model_.b_;
    (this->super_AlexNode<double,_double>).model_.a_ =
         dVar10 * (this->super_AlexNode<double,_double>).model_.a_;
    (this->super_AlexNode<double,_double>).model_.b_ = dVar10 * dVar4;
    return iVar8;
  }
  __assert_fail("log2_expansion_factor >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex_nodes.h"
                ,0x77,
                "int alex::AlexModelNode<double, double>::expand(int) [T = double, P = double, Alloc = std::allocator<std::pair<double, double>>]"
               );
}

Assistant:

int expand(int log2_expansion_factor) {
    assert(log2_expansion_factor >= 0);
    int expansion_factor = 1 << log2_expansion_factor;
    int num_new_children = num_children_ * expansion_factor;
    auto new_children = new (pointer_allocator().allocate(num_new_children))
        AlexNode<T, P>*[num_new_children];
    int cur = 0;
    while (cur < num_children_) {
      AlexNode<T, P>* cur_child = children_[cur];
      int cur_child_repeats = 1 << cur_child->duplication_factor_;
      for (int i = expansion_factor * cur;
           i < expansion_factor * (cur + cur_child_repeats); i++) {
        new_children[i] = cur_child;
      }
      cur_child->duplication_factor_ += log2_expansion_factor;
      cur += cur_child_repeats;
    }
    pointer_allocator().deallocate(children_, num_children_);
    children_ = new_children;
    num_children_ = num_new_children;
    this->model_.expand(expansion_factor);
    return expansion_factor;
  }